

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Intersectors * __thiscall
embree::BVH8Factory::BVH8OBBVirtualCurveIntersectors
          (Intersectors *__return_storage_ptr__,BVH8Factory *this,BVH8 *bvh,
          VirtualCurveIntersector *leafIntersector,IntersectVariant ivariant)

{
  Intersector16 local_40;
  
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->collider).name = (char *)0x0;
  __return_storage_ptr__->ptr = (AccelData *)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  if (ivariant == ROBUST) {
    __return_storage_ptr__->ptr = &bvh->super_AccelData;
    __return_storage_ptr__->leafIntersector = leafIntersector;
    (*this->BVH8OBBVirtualCurveIntersectorRobust1)(&__return_storage_ptr__->intersector1);
    (*this->BVH8OBBVirtualCurveIntersectorRobust4Hybrid)((Intersector4 *)&local_40);
    (__return_storage_ptr__->intersector4).name = local_40.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_40.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_40.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_40.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_40.occluded._4_4_;
    (*this->BVH8OBBVirtualCurveIntersectorRobust8Hybrid)((Intersector8 *)&local_40);
    (__return_storage_ptr__->intersector8).name = local_40.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_40.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_40.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_40.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_40.occluded._4_4_;
    (*this->BVH8OBBVirtualCurveIntersectorRobust16Hybrid)(&local_40);
  }
  else {
    if (ivariant != FAST) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->ptr = &bvh->super_AccelData;
    __return_storage_ptr__->leafIntersector = leafIntersector;
    (*this->BVH8OBBVirtualCurveIntersector1)(&__return_storage_ptr__->intersector1);
    (*this->BVH8OBBVirtualCurveIntersector4Hybrid)((Intersector4 *)&local_40);
    (__return_storage_ptr__->intersector4).name = local_40.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_40.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
         local_40.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_40.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
         local_40.occluded._4_4_;
    (*this->BVH8OBBVirtualCurveIntersector8Hybrid)((Intersector8 *)&local_40);
    (__return_storage_ptr__->intersector8).name = local_40.name;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_40.intersect._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
         local_40.intersect._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_40.occluded._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
         local_40.occluded._4_4_;
    (*this->BVH8OBBVirtualCurveIntersector16Hybrid)(&local_40);
  }
  (__return_storage_ptr__->intersector16).name = local_40.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_40.intersect._4_4_,local_40.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_40.occluded._4_4_,local_40.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH8Factory::BVH8OBBVirtualCurveIntersectors(BVH8* bvh, VirtualCurveIntersector* leafIntersector, IntersectVariant ivariant)
  {
    switch (ivariant) {
    case IntersectVariant::FAST:
    {
      Accel::Intersectors intersectors;
      intersectors.ptr = bvh;
      intersectors.leafIntersector = leafIntersector;
      intersectors.intersector1  = BVH8OBBVirtualCurveIntersector1();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8OBBVirtualCurveIntersector4Hybrid();
      intersectors.intersector8  = BVH8OBBVirtualCurveIntersector8Hybrid();
      intersectors.intersector16 = BVH8OBBVirtualCurveIntersector16Hybrid();
#endif
      return intersectors;
    }
    case IntersectVariant::ROBUST:
    {
      Accel::Intersectors intersectors;
      intersectors.ptr = bvh;
      intersectors.leafIntersector = leafIntersector;
      intersectors.intersector1  = BVH8OBBVirtualCurveIntersectorRobust1();
#if defined (EMBREE_RAY_PACKETS)
      intersectors.intersector4  = BVH8OBBVirtualCurveIntersectorRobust4Hybrid();
      intersectors.intersector8  = BVH8OBBVirtualCurveIntersectorRobust8Hybrid();
      intersectors.intersector16 = BVH8OBBVirtualCurveIntersectorRobust16Hybrid();
#endif
      return intersectors;
    }
    default: assert(false);
    }
    return Accel::Intersectors();
  }